

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O1

QList<QHstsPolicy> * __thiscall
QHstsStore::readPolicies(QList<QHstsPolicy> *__return_storage_ptr__,QHstsStore *this)

{
  bool bVar1;
  char cVar2;
  QString *key;
  QString *key_00;
  long lVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QByteArrayView QVar6;
  QHstsPolicy restoredPolicy;
  QHstsPolicy local_90;
  QArrayDataPointer<QString> local_88;
  QString local_70;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QHstsPolicy *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QVar4.m_size = (size_t)"StrictTransportSecurity";
  QVar4.field_0.m_data = &this->store;
  QSettings::beginGroup(QVar4);
  QVar5.m_size = (size_t)"Policies";
  QVar5.field_0.m_data = &this->store;
  QSettings::beginGroup(QVar5);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QSettings::childKeys();
  if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
    lVar3 = local_88.size * 0x18;
    key_00 = local_88.ptr;
    do {
      local_90.d.d.ptr = (QSharedDataPointer<QHstsPolicyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHstsPolicy::QHstsPolicy(&local_90);
      bVar1 = deserializePolicy(this,key_00,&local_90);
      if (bVar1) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QString::toLatin1_helper((QString *)&local_70);
        QByteArray::fromHex(&local_58);
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
          }
        }
        QVar6.m_data = (storage_type *)local_58.d.size;
        QVar6.m_size = (qsizetype)&local_70;
        QString::fromUtf8(QVar6);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
        QHstsPolicy::setHost(&local_90,&local_70,DecodedMode);
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
          }
        }
        QtPrivate::QMovableArrayOps<QHstsPolicy>::emplace<QHstsPolicy>
                  ((QMovableArrayOps<QHstsPolicy> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_90);
        QList<QHstsPolicy>::end(__return_storage_ptr__);
      }
      else {
        cVar2 = QSettings::isWritable();
        if (cVar2 != '\0') {
          evictPolicy(this,key_00);
        }
      }
      QHstsPolicy::~QHstsPolicy(&local_90);
      key_00 = key_00 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  QSettings::endGroup();
  QSettings::endGroup();
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QHstsPolicy> QHstsStore::readPolicies()
{
    // This function only attempts to read policies, making no decision about
    // expired policies. It's up to a user (QHstsCache) to mark these policies
    // for deletion and sync the store later. But we immediately remove keys/values
    // (if the store isWritable) for the policies that we fail to read.
    QList<QHstsPolicy> policies;

    beginHstsGroups();

    const QStringList keys = store.childKeys();
    for (const auto &key : keys) {
        QHstsPolicy restoredPolicy;
        if (deserializePolicy(key, restoredPolicy)) {
            restoredPolicy.setHost(settings_key_to_host_name(key));
            policies.push_back(std::move(restoredPolicy));
        } else if (isWritable()) {
            evictPolicy(key);
        }
    }

    endHstsGroups();

    return policies;
}